

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_computer.h
# Opt level: O0

void __thiscall
directed_flag_complex_computer::directed_flag_complex_computer_t::directed_flag_complex_computer_t
          (directed_flag_complex_computer_t *this,filtered_directed_graph_t *_graph,
          flagser_parameters *params)

{
  byte bVar1;
  pointer pfVar2;
  undefined2 *in_RDX;
  directed_graph_t *in_RSI;
  undefined8 *in_RDI;
  size_t in_stack_000002a8;
  filtration_algorithm_t *in_stack_000002b0;
  filtered_directed_graph_t *in_stack_000002b8;
  directed_flag_complex_t *in_stack_000002c0;
  value_type_conflict3 *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  allocator_type *in_stack_ffffffffffffff58;
  allocator_type *in_stack_ffffffffffffff60;
  size_type in_stack_ffffffffffffff68;
  undefined8 *__n;
  vector<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_>
  *in_stack_ffffffffffffff70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  
  *in_RDI = in_RSI;
  pfVar2 = std::unique_ptr<filtration_algorithm_t,_std::default_delete<filtration_algorithm_t>_>::
           get((unique_ptr<filtration_algorithm_t,_std::default_delete<filtration_algorithm_t>_> *)
               CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
  in_RDI[1] = pfVar2;
  *(undefined2 *)(in_RDI + 2) = *in_RDX;
  *(undefined2 *)((long)in_RDI + 0x12) = in_RDX[1];
  *(undefined4 *)((long)in_RDI + 0x14) = 0;
  *(undefined1 *)(in_RDI + 3) = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1f235c);
  std::__cxx11::string::string((string *)(in_RDI + 7),(string *)(in_RDX + 0x40));
  in_RDI[0xb] = *(undefined8 *)(in_RDX + 0xc);
  directed_flag_complex_t::directed_flag_complex_t
            ((directed_flag_complex_t *)(in_RDI + 0xc),(filtered_directed_graph_t *)*in_RDI);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x1f23b6);
  std::allocator<compressed_sparse_matrix<int>_>::allocator
            ((allocator<compressed_sparse_matrix<int>_> *)0x1f23e7);
  std::vector<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_>::
  vector(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  std::allocator<compressed_sparse_matrix<int>_>::~allocator
            ((allocator<compressed_sparse_matrix<int>_> *)0x1f240a);
  __n = in_RDI + 0x13;
  this_00 = *(vector<unsigned_long,_std::allocator<unsigned_long>_> **)(in_RDX + 0xc);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1f2449);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (this_00,(size_type)__n,(value_type_conflict3 *)in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff58);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x1f2474);
  *(undefined2 *)(in_RDI + 0x16) = in_RDX[2];
  directed_graph_t::vertex_number(in_RSI);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),in_stack_ffffffffffffff48
            );
  directed_graph_t::edge_number((directed_graph_t *)0x1f24d6);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),in_stack_ffffffffffffff48
            );
  if ((*(ushort *)((long)in_RDI + 0x12) < 2) ||
     ((in_RDI[1] != 0 && (bVar1 = (**(code **)(*(long *)in_RDI[1] + 0x28))(), (bVar1 & 1) != 0)))) {
    prepare_graph_filtration<directed_flag_complex_t>
              (in_stack_000002c0,in_stack_000002b8,in_stack_000002b0,in_stack_000002a8);
  }
  return;
}

Assistant:

directed_flag_complex_computer_t(filtered_directed_graph_t& _graph, const flagser_parameters& params)
	    : graph(_graph), filtration_algorithm(params.filtration_algorithm.get()), max_dimension(params.max_dimension),
	      min_dimension(params.min_dimension), cache(params.cache), nb_threads(params.nb_threads), flag_complex(graph),
	      coboundary_matrix(params.nb_threads), coboundary_matrix_offsets(params.nb_threads, 0),
	      modulus(params.modulus) {
		cell_count.push_back(_graph.vertex_number());
		cell_count.push_back(_graph.edge_number());

		// Order the edges and compute the correct filtration
		if (min_dimension <= 1 || (filtration_algorithm != nullptr && filtration_algorithm->needs_face_filtration()))
			prepare_graph_filtration(flag_complex, graph, filtration_algorithm, nb_threads);
	}